

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

void chaiscript::bootstrap::standard_library::
     back_insertion_sequence_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
               (string *type,Module *m)

{
  Module *pMVar1;
  allocator<char> local_139;
  string local_138;
  code *local_118;
  undefined8 local_110;
  Proxy_Function local_108;
  Module *local_f8;
  Module *local_f0;
  string local_e8;
  code *local_c8;
  undefined8 local_c0;
  Proxy_Function local_b8;
  allocator<char> local_a1;
  string local_a0;
  anon_class_1_0_00000001_for_m_f local_79;
  Proxy_Function local_78 [2];
  allocator<char> local_51;
  string local_50;
  anon_class_1_0_00000001_for_m_f local_29;
  Proxy_Function local_28;
  Module *local_18;
  Module *m_local;
  string *type_local;
  
  local_18 = m;
  m_local = (Module *)type;
  fun<chaiscript::bootstrap::standard_library::back_insertion_sequence_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&)_1_>
            ((chaiscript *)&local_28,&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"back",&local_51);
  Module::add(m,&local_28,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_28);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::back_insertion_sequence_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_1_>
            ((chaiscript *)local_78,&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"back",&local_a1);
  Module::add(pMVar1,local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_78);
  pMVar1 = local_18;
  local_c8 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
             push_back;
  local_c0 = 0;
  fun<void(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::*)(chaiscript::Boxed_Value_const&)>
            ((chaiscript *)&local_b8,
             (offset_in_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_to_subr
              *)&local_c8);
  local_f8 = local_18;
  local_f0 = m_local;
  back_insertion_sequence_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>(std::__cxx11::string_const&,chaiscript::Module&)
  ::{lambda()#1}::operator()[abi_cxx11_(&local_e8,&local_f8);
  Module::add(pMVar1,&local_b8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_b8);
  pMVar1 = local_18;
  local_118 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
              pop_back;
  local_110 = 0;
  fun<void(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::*)()noexcept>
            ((chaiscript *)&local_108,
             (offset_in_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_to_subr
              *)&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"pop_back",&local_139);
  Module::add(pMVar1,&local_108,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_108);
  return;
}

Assistant:

void back_insertion_sequence_type(const std::string &type, Module &m) {
    m.add(fun([](ContainerType &container) -> decltype(auto) {
            if (container.empty()) {
              throw std::range_error("Container empty");
            } else {
              return (container.back());
            }
          }),
          "back");
    m.add(fun([](const ContainerType &container) -> decltype(auto) {
            if (container.empty()) {
              throw std::range_error("Container empty");
            } else {
              return (container.back());
            }
          }),
          "back");

    using push_back = void (ContainerType::*)(const typename ContainerType::value_type &);
    m.add(fun(static_cast<push_back>(&ContainerType::push_back)), [&]() -> std::string {
      if (typeid(typename ContainerType::value_type) == typeid(Boxed_Value)) {
        m.eval("# Pushes the second value onto the container while making a clone of the value\n"
               "def push_back("
               + type
               + " container, x)\n"
                 "{ \n"
                 "  if (x.is_var_return_value()) {\n"
                 "    x.reset_var_return_value() \n"
                 "    container.push_back_ref(x) \n"
                 "  } else { \n"
                 "    container.push_back_ref(clone(x)); \n"
                 "  }\n"
                 "} \n");

        return "push_back_ref";
      } else {
        return "push_back";
      }
    }());

    m.add(fun(&ContainerType::pop_back), "pop_back");
  }